

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_RemoveOption_Test::~TApp_RemoveOption_Test(TApp_RemoveOption_Test *this)

{
  TApp_RemoveOption_Test *this_local;
  
  ~TApp_RemoveOption_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, RemoveOption) {
    app.add_flag("--one");
    auto opt = app.add_flag("--two");

    EXPECT_TRUE(app.remove_option(opt));
    EXPECT_FALSE(app.remove_option(opt));

    args = {"--two"};

    EXPECT_THROW(run(), CLI::ExtrasError);
}